

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtWrenchesAndJointTorquesEstimator.cpp
# Opt level: O0

bool __thiscall
iDynTree::ExtWrenchesAndJointTorquesEstimator::computeExpectedFTSensorsMeasurements
          (ExtWrenchesAndJointTorquesEstimator *this,LinkUnknownWrenchContacts *unknowns,
          SensorsMeasurements *predictedMeasures,LinkContactWrenches *estimatedContactWrenches,
          JointDOFsDoubleArray *estimatedJointTorques)

{
  bool bVar1;
  LinkWrenches *this_00;
  LinkWrenches *in_RCX;
  SensorsMeasurements *in_RDX;
  Model *in_RDI;
  LinkWrenches *pLVar2;
  bool ok;
  LinkAccArray *in_stack_00000150;
  LinkVelArray *in_stack_00000158;
  JointPosDoubleArray *in_stack_00000160;
  LinkUnknownWrenchContacts *in_stack_00000168;
  Traversal *in_stack_00000170;
  Model *in_stack_00000178;
  estimateExternalWrenchesBuffers *in_stack_00000190;
  LinkContactWrenches *in_stack_00000198;
  byte local_42;
  byte local_41;
  bool local_1;
  
  if (((byte)in_RDI[0x160] & 1) == 0) {
    iDynTree::reportError
              ("ExtWrenchesAndJointTorquesEstimator","computeExpectedFTSensorsMeasurements",
               "Model and sensors information not set.");
    local_1 = false;
  }
  else if (((byte)in_RDI[0x161] & 1) == 0) {
    iDynTree::reportError
              ("ExtWrenchesAndJointTorquesEstimator","computeExpectedFTSensorsMeasurements",
               "Kinematic information not set.");
    local_1 = false;
  }
  else {
    pLVar2 = (LinkWrenches *)(in_RDI + 0x300);
    this_00 = in_RCX;
    bVar1 = estimateExternalWrenchesWithoutInternalFT
                      (in_stack_00000178,in_stack_00000170,in_stack_00000168,in_stack_00000160,
                       in_stack_00000158,in_stack_00000150,in_stack_00000190,in_stack_00000198);
    if (bVar1) {
      local_41 = 0;
      if (bVar1) {
        local_41 = iDynTree::LinkContactWrenches::computeNetWrenches(in_RCX);
      }
      if ((local_41 & 1) == 0) {
        iDynTree::reportError
                  ("ExtWrenchesAndJointTorquesEstimator","estimateExtWrenchesAndJointTorques",
                   "Error in computing the net external wrenches from the estimated contact forces")
        ;
        local_1 = false;
      }
      else {
        local_42 = 0;
        if ((local_41 & 1) != 0) {
          pLVar2 = (LinkWrenches *)(in_RDI + 0x288);
          this_00 = (LinkWrenches *)(in_RDI + 0x2a0);
          local_42 = iDynTree::RNEADynamicPhase
                               (in_RDI,(Traversal *)(in_RDI + 0x168),
                                (JointPosDoubleArray *)(in_RDI + 0x1e0),
                                (LinkVelArray *)(in_RDI + 0x240),(LinkAccArray *)(in_RDI + 600),
                                (LinkWrenches *)(in_RDI + 0x270),pLVar2,
                                (FreeFloatingGeneralizedTorques *)this_00);
        }
        local_1 = (bool)(local_42 & 1);
        if (local_1 == false) {
          iDynTree::reportError
                    ("ExtWrenchesAndJointTorquesEstimator","estimateExtWrenchesAndJointTorques",
                     "Error in computing the dynamic phase of the RNEA.");
          local_1 = false;
        }
        else {
          iDynTree::predictSensorsMeasurementsFromRawBuffers
                    (in_RDI,(Traversal *)(in_RDI + 0x168),(LinkVelArray *)(in_RDI + 0x240),
                     (LinkAccArray *)(in_RDI + 600),(LinkWrenches *)(in_RDI + 0x288),in_RDX);
          iDynTree::FreeFloatingGeneralizedTorques::jointTorques();
          JointDOFsDoubleArray::operator=
                    ((JointDOFsDoubleArray *)this_00,(JointDOFsDoubleArray *)pLVar2);
        }
      }
    }
    else {
      iDynTree::reportError
                ("ExtWrenchesAndJointTorquesEstimator","estimateExtWrenchesAndJointTorques",
                 "Error in estimating the external contact wrenches without using the internal FT sensors."
                );
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool ExtWrenchesAndJointTorquesEstimator::computeExpectedFTSensorsMeasurements(const LinkUnknownWrenchContacts& unknowns,
                                                                                     SensorsMeasurements& predictedMeasures,
                                                                                     LinkContactWrenches& estimatedContactWrenches,
                                                                                     JointDOFsDoubleArray& estimatedJointTorques)
{
    if( !m_isModelValid )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","computeExpectedFTSensorsMeasurements",
                    "Model and sensors information not set.");
        return false;
    }

    if( !m_isKinematicsUpdated )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","computeExpectedFTSensorsMeasurements",
                    "Kinematic information not set.");
        return false;
    }

    /**
     * Compute external wrenches
     */
    bool ok = estimateExternalWrenchesWithoutInternalFT(m_model,m_dynamicTraversal,unknowns,
                                                        m_jointPos,m_linkVels,m_linkProperAccs,
                                                        m_calibBufs,estimatedContactWrenches);

    if( !ok )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","estimateExtWrenchesAndJointTorques",
                    "Error in estimating the external contact wrenches without using the internal FT sensors.");
        return false;
    }

    /**
     * Compute net external wrenches
     */
    ok = ok && estimatedContactWrenches.computeNetWrenches(m_linkNetExternalWrenches);

    if( !ok )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","estimateExtWrenchesAndJointTorques",
                    "Error in computing the net external wrenches from the estimated contact forces");
        return false;
    }

    /**
     * Compute joint torques
     */
    ok = ok && RNEADynamicPhase(m_model,m_dynamicTraversal,m_jointPos,m_linkVels,m_linkProperAccs,
                                m_linkNetExternalWrenches,m_linkIntWrenches,m_generalizedTorques);

    if( !ok )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","estimateExtWrenchesAndJointTorques",
                    "Error in computing the dynamic phase of the RNEA.");
        return false;
    }

    /**
     * Simulate FT sensor measurements
     */
    predictSensorsMeasurementsFromRawBuffers(m_model,m_dynamicTraversal,
                                             m_linkVels,m_linkProperAccs,m_linkIntWrenches,predictedMeasures);


    /**
     * Copy the joint torques computed by the RNEA to the output
     */
    estimatedJointTorques = m_generalizedTorques.jointTorques();


    return ok;
}